

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_shader_modules
          (Impl *this,StateCreatorInterface *iface,Value *modules,uint8_t *varint,size_t varint_size
          )

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  long lVar1;
  size_t size;
  ulonglong uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  ConstMemberIterator CVar8;
  Ch *pCVar9;
  const_iterator cVar10;
  Type pGVar11;
  Number NVar12;
  uint32_t *words;
  mapped_type *ppVVar13;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  Pointer this_02;
  long *in_FS_OFFSET;
  Hash hash;
  ulonglong local_70;
  StateCreatorInterface *local_68;
  Data local_60;
  size_t local_50;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  void *local_40;
  Value *local_38;
  
  local_68 = iface;
  local_60.s.str = (Ch *)varint;
  local_50 = varint_size;
  if ((modules->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x49a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::MemberCount() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar6 = (ulong)(modules->data_).s.length;
  if (uVar6 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    size = uVar6 * 0x28;
    pvVar7 = ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (pvVar7 != (void *)0x0) {
      memset(pvVar7,0,size);
    }
    if ((modules->data_).f.flags != 3) {
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x4d8,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  this_02 = (Pointer)((ulong)(modules->data_).s.str & 0xffffffffffff);
  CVar8 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(modules);
  if (CVar8.ptr_ != this_02) {
    this_01 = &(this->replayed_shader_modules)._M_h;
    uVar6 = 0;
    local_48 = this_01;
    local_40 = pvVar7;
    local_38 = modules;
    do {
      pCVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_02->name);
      local_70 = strtoull(pCVar9,(char **)0x0,0x10);
      cVar10 = std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(this_01,&local_70);
      if (cVar10.
          super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        this_00 = &this_02->value;
        *(undefined4 *)((long)pvVar7 + uVar6 * 0x28) = 0x10;
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"flags");
        if ((undefined1  [16])
            ((undefined1  [16])pGVar11->data_ & (undefined1  [16])0x40000000000000) ==
            (undefined1  [16])0x0) {
          __assert_fail("data_.f.flags & kUintFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x719,
                        "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        pvVar7 = (void *)((long)pvVar7 + uVar6 * 0x28);
        *(SizeType *)((long)pvVar7 + 0x10) = (pGVar11->data_).s.length;
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"codeSize");
        if ((undefined1  [16])
            ((undefined1  [16])pGVar11->data_ & (undefined1  [16])0x100000000000000) ==
            (undefined1  [16])0x0) goto LAB_00119a72;
        *(Number *)((long)pvVar7 + 0x18) = (pGVar11->data_).n;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_60.s,(Ch *)this_00);
        uVar3 = local_60.n;
        NVar12.i = (I)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::MemberEnd(this_00);
        if (uVar3 == NVar12.i64) {
LAB_00119965:
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>
                              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)this_00,"code");
          pCVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pGVar11);
          words = (uint32_t *)
                  decode_base64(&this->allocator,pCVar9,*(size_t *)((long)pvVar7 + 0x18));
        }
        else {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_60.s,(Ch *)this_00);
          uVar3 = local_60.n;
          NVar12.i = (I)rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::MemberEnd(this_00);
          if (uVar3 == NVar12.i64) goto LAB_00119965;
          words = (uint32_t *)
                  ScratchAllocator::allocate_raw
                            (&this->allocator,*(size_t *)((long)pvVar7 + 0x18),0x40);
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>
                              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)this_00,"varintOffset");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar11->data_ & (undefined1  [16])0x100000000000000) ==
              (undefined1  [16])0x0) {
LAB_00119a72:
            __assert_fail("data_.f.flags & kUint64Flag",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x71b,
                          "uint64_t rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint64() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          lVar1 = *(long *)&pGVar11->data_;
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>
                              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)this_00,"varintSize");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar11->data_ & (undefined1  [16])0x100000000000000) ==
              (undefined1  [16])0x0) goto LAB_00119a72;
          if (local_50 < *(size_t *)&pGVar11->data_ + lVar1) {
            if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
              return false;
            }
            bVar4 = Internal::log_thread_callback
                              (LOG_ERROR,"Binary varint buffer overflows payload.\n");
            if (bVar4) {
              return false;
            }
            parse_shader_modules();
            return false;
          }
          bVar4 = decode_varint(words,*(ulong *)((long)pvVar7 + 0x18) >> 2,
                                (uint8_t *)(local_60.s.str + lVar1),*(size_t *)&pGVar11->data_);
          if (!bVar4) {
            if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
              return false;
            }
            bVar4 = Internal::log_thread_callback(LOG_ERROR,"Invalid varint format.\n");
            if (bVar4) {
              return false;
            }
            parse_shader_modules();
            return false;
          }
        }
        this_01 = local_48;
        uVar2 = local_70;
        *(uint32_t **)((long)pvVar7 + 0x20) = words;
        ppVVar13 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_48,&local_70);
        iVar5 = (*local_68->_vptr_StateCreatorInterface[8])(local_68,uVar2,pvVar7,ppVVar13);
        modules = local_38;
        pvVar7 = local_40;
        if ((char)iVar5 == '\0') {
          return false;
        }
      }
      this_02 = this_02 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
      CVar8 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(modules);
    } while (this_02 != CVar8.ptr_);
  }
  (*local_68->_vptr_StateCreatorInterface[0x11])();
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_shader_modules(StateCreatorInterface &iface, const Value &modules,
                                               const uint8_t *varint, size_t varint_size)
{
	auto *infos = allocator.allocate_n_cleared<VkShaderModuleCreateInfo>(modules.MemberCount());

	unsigned index = 0;
	for (auto itr = modules.MemberBegin(); itr != modules.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_shader_modules.count(hash))
			continue;

		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
		info.flags = obj["flags"].GetUint();
		info.codeSize = obj["codeSize"].GetUint64();

		if (obj.HasMember("varintOffset") && obj.HasMember("varintSize"))
		{
			uint32_t *decoded = static_cast<uint32_t *>(allocator.allocate_raw(info.codeSize, 64));
			auto offset = obj["varintOffset"].GetUint64();
			auto size = obj["varintSize"].GetUint64();
			if (offset + size > varint_size)
			{
				LOGE_LEVEL("Binary varint buffer overflows payload.\n");
				return false;
			}

			if (!decode_varint(decoded, info.codeSize / 4, varint + offset, size))
			{
				LOGE_LEVEL("Invalid varint format.\n");
				return false;
			}

			info.pCode = decoded;
		}
		else
			info.pCode = reinterpret_cast<uint32_t *>(decode_base64(allocator, obj["code"].GetString(), info.codeSize));

		if (!iface.enqueue_create_shader_module(hash, &info, &replayed_shader_modules[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}